

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O2

void helics::generateInterfaceConfig(json *iblock,HandleManager *hm,GlobalFederateId *fed)

{
  InterfaceType IVar1;
  value_t vVar2;
  int iVar3;
  json_value jVar4;
  reference pvVar5;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  bool includeID;
  _Elt_pointer handle;
  _Elt_pointer pBVar6;
  _Elt_pointer pBVar7;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  data local_c0;
  data local_b0;
  _Map_pointer local_a0;
  _Elt_pointer local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  data local_68;
  data local_58;
  data local_48;
  _Elt_pointer local_38;
  
  iVar3 = fed->gid;
  includeID = iVar3 == -1700000000 || iVar3 == -2010000000;
  handle = (hm->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pBVar7 = (hm->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  local_a0 = (hm->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  pBVar6 = (hm->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  local_98 = pBVar7;
  local_38 = pBVar6;
  while (handle != pBVar6) {
    if ((((handle->handle).fed_id.gid == fed->gid) || (iVar3 == -1700000000)) ||
       (iVar3 == -2010000000)) {
      IVar1 = handle->handleType;
      if (IVar1 == TRANSLATOR) {
        if ((local_70 & 1) == 0) {
          init_03._M_len = 0;
          init_03._M_array = (iterator)&local_b0;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init_03);
          pvVar5 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)iblock,"translators");
          vVar2 = (pvVar5->m_data).m_type;
          (pvVar5->m_data).m_type = local_b0.m_type;
          jVar4 = (pvVar5->m_data).m_value;
          (pvVar5->m_data).m_value = local_b0.m_value;
          local_b0.m_type = vVar2;
          local_b0.m_value = jVar4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_b0);
        }
        storeTranslator(handle,iblock,includeID);
        local_70 = CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1);
      }
      else if (IVar1 == FILTER) {
        if ((local_78 & 1) == 0) {
          init_00._M_len = 0;
          init_00._M_array = (iterator)&local_58;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init_00);
          pvVar5 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)iblock,"filters");
          vVar2 = (pvVar5->m_data).m_type;
          (pvVar5->m_data).m_type = local_58.m_type;
          jVar4 = (pvVar5->m_data).m_value;
          (pvVar5->m_data).m_value = local_58.m_value;
          local_58.m_type = vVar2;
          local_58.m_value = jVar4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_58);
          pBVar7 = local_98;
        }
        storeFilter(handle,iblock,includeID);
        local_78 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      }
      else if (IVar1 == INPUT) {
        if ((local_80 & 1) == 0) {
          init_02._M_len = 0;
          init_02._M_array = (iterator)&local_48;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init_02);
          pvVar5 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)iblock,"inputs");
          vVar2 = (pvVar5->m_data).m_type;
          (pvVar5->m_data).m_type = local_48.m_type;
          jVar4 = (pvVar5->m_data).m_value;
          (pvVar5->m_data).m_value = local_48.m_value;
          local_48.m_type = vVar2;
          local_48.m_value = jVar4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_48);
        }
        storeInput(handle,iblock,includeID);
        local_80 = CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
      }
      else if (IVar1 == PUBLICATION) {
        if ((local_90 & 1) == 0) {
          init_01._M_len = 0;
          init_01._M_array = (iterator)&local_c0;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init_01);
          pvVar5 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)iblock,"publications");
          vVar2 = (pvVar5->m_data).m_type;
          (pvVar5->m_data).m_type = local_c0.m_type;
          jVar4 = (pvVar5->m_data).m_value;
          (pvVar5->m_data).m_value = local_c0.m_value;
          local_c0.m_type = vVar2;
          local_c0.m_value = jVar4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_c0);
        }
        storePublication(handle,iblock,includeID);
        local_90 = CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
      }
      else if (IVar1 == ENDPOINT) {
        if ((local_88 & 1) == 0) {
          init._M_len = 0;
          init._M_array = (iterator)&local_68;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init);
          pvVar5 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)iblock,"endpoints");
          vVar2 = (pvVar5->m_data).m_type;
          (pvVar5->m_data).m_type = local_68.m_type;
          jVar4 = (pvVar5->m_data).m_value;
          (pvVar5->m_data).m_value = local_68.m_value;
          local_68.m_type = vVar2;
          local_68.m_value = jVar4;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_68);
          pBVar6 = local_38;
          pBVar7 = local_98;
        }
        storeEndpoint(handle,iblock,includeID);
        local_88 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
    }
    handle = handle + 1;
    if (handle == pBVar7) {
      handle = local_a0[1];
      local_a0 = local_a0 + 1;
      pBVar7 = handle + 3;
      local_98 = pBVar7;
    }
  }
  return;
}

Assistant:

void generateInterfaceConfig(nlohmann::json& iblock,
                             const helics::HandleManager& hm,
                             const helics::GlobalFederateId& fed)

{
    bool hasPubs{false};
    bool hasEpts{false};
    bool hasInputs{false};
    bool hasFilt{false};
    bool hasTranslators{false};
    bool allInfo = !fed.isValid();
    for (const auto& handle : hm) {
        if (handle.handle.fed_id == fed || allInfo) {
            switch (handle.handleType) {
                case InterfaceType::ENDPOINT:
                    if (!hasEpts) {
                        iblock["endpoints"] = nlohmann::json::array();
                        hasEpts = true;
                    }
                    storeEndpoint(handle, iblock, allInfo);
                    break;
                case InterfaceType::INPUT:
                    if (!hasInputs) {
                        iblock["inputs"] = nlohmann::json::array();
                        hasInputs = true;
                    }
                    storeInput(handle, iblock, allInfo);
                    break;
                case InterfaceType::TRANSLATOR:
                    if (!hasTranslators) {
                        iblock["translators"] = nlohmann::json::array();
                        hasTranslators = true;
                    }
                    storeTranslator(handle, iblock, allInfo);
                    break;
                case InterfaceType::PUBLICATION:
                    if (!hasPubs) {
                        iblock["publications"] = nlohmann::json::array();
                        hasPubs = true;
                    }
                    storePublication(handle, iblock, allInfo);
                    break;
                case InterfaceType::FILTER:
                    if (!hasFilt) {
                        iblock["filters"] = nlohmann::json::array();
                        hasFilt = true;
                    }
                    storeFilter(handle, iblock, allInfo);
                    break;
                default:
                    break;
            }
        }
    }
}